

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

bool __thiscall FPolyObj::RotatePolyobj(FPolyObj *this,DAngle *angle,bool fromsave)

{
  undefined8 *puVar1;
  double *pdVar2;
  FPolyVertex *pFVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined8 uVar15;
  FBoundingBox bounds;
  byte bVar16;
  bool bVar17;
  vertex_t **ppvVar18;
  ulong uVar19;
  FPolyObj *this_00;
  byte bVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 local_48;
  double dStack_40;
  
  dVar13 = (this->Bounds).m_Box[0];
  dVar14 = (this->Bounds).m_Box[1];
  dVar11 = (this->Bounds).m_Box[2];
  dVar12 = (this->Bounds).m_Box[3];
  UnLinkPolyobj(this);
  if ((this->Vertices).Count != 0) {
    ppvVar18 = (this->Vertices).Array;
    lVar21 = 0;
    uVar19 = 0;
    do {
      uVar15 = (*(undefined8 **)((long)ppvVar18 + lVar21))[1];
      puVar1 = (undefined8 *)((long)&(((this->PrevPts).Array)->pos).X + lVar21 * 2);
      *puVar1 = **(undefined8 **)((long)ppvVar18 + lVar21);
      puVar1[1] = uVar15;
      pdVar2 = (double *)((long)&(((this->OriginalPts).Array)->pos).X + lVar21 * 2);
      __x = *pdVar2;
      dVar9 = pdVar2[1];
      dVar7 = FFastTrig::sin(&fasttrig,__x);
      dVar8 = FFastTrig::cos(&fasttrig,dVar7);
      dVar10 = (this->StartSpot).pos.Y;
      ppvVar18 = (this->Vertices).Array;
      pdVar2 = *(double **)((long)ppvVar18 + lVar21);
      *pdVar2 = (this->StartSpot).pos.X + (dVar8 * __x - dVar9 * dVar7);
      pdVar2[1] = dVar10 + dVar8 * dVar9 + __x * dVar7;
      uVar19 = uVar19 + 1;
      lVar21 = lVar21 + 8;
    } while (uVar19 < (this->Vertices).Count);
  }
  this->validcount = this->validcount + 1;
  UpdateBBox(this);
  if ((!fromsave) && ((this->Sidedefs).Count != 0)) {
    uVar19 = 0;
    bVar16 = 0;
    do {
      bVar20 = bVar16;
      bVar17 = CheckMobjBlocking(this,(this->Sidedefs).Array[uVar19]);
      uVar19 = uVar19 + 1;
      bVar16 = bVar20 | bVar17;
    } while (uVar19 < (this->Sidedefs).Count);
    if (bVar20 != 0 || bVar17) {
      uVar19 = (ulong)(this->Vertices).Count;
      if (uVar19 != 0) {
        ppvVar18 = (this->Vertices).Array;
        pFVar3 = (this->PrevPts).Array;
        lVar21 = 0;
        do {
          puVar4 = *(undefined8 **)((long)ppvVar18 + lVar21);
          puVar1 = (undefined8 *)((long)&(pFVar3->pos).X + lVar21 * 2);
          uVar15 = puVar1[1];
          *puVar4 = *puVar1;
          puVar4[1] = uVar15;
          lVar21 = lVar21 + 8;
        } while (uVar19 << 3 != lVar21);
      }
      UpdateBBox(this);
      LinkPolyobj(this);
      return false;
    }
  }
  (this->Angle).Degrees = angle->Degrees + (this->Angle).Degrees;
  LinkPolyobj(this);
  this_00 = this;
  ClearSubsectorLinks(this);
  dVar7 = (this->Bounds).m_Box[2];
  dVar8 = (this->Bounds).m_Box[3];
  uVar22 = -(ulong)(dVar7 < dVar11);
  uVar23 = -(ulong)(dVar12 < dVar8);
  uVar19 = (ulong)dVar8 & uVar23;
  auVar24._0_8_ = ~uVar22 & (ulong)dVar11;
  auVar24._8_8_ = ~uVar23 & (ulong)dVar12;
  auVar5._8_4_ = (int)uVar19;
  auVar5._0_8_ = (ulong)dVar7 & uVar22;
  auVar5._12_4_ = (int)(uVar19 >> 0x20);
  dVar11 = (this->Bounds).m_Box[0];
  dVar12 = (this->Bounds).m_Box[1];
  uVar22 = -(ulong)(dVar13 < dVar11);
  uVar23 = -(ulong)(dVar12 < dVar14);
  uVar19 = (ulong)dVar12 & uVar23;
  auVar25._0_8_ = ~uVar22 & (ulong)dVar13;
  auVar25._8_8_ = ~uVar23 & (ulong)dVar14;
  auVar6._8_4_ = (int)uVar19;
  auVar6._0_8_ = (ulong)dVar11 & uVar22;
  auVar6._12_4_ = (int)(uVar19 >> 0x20);
  local_48 = SUB168(auVar24 | auVar5,0);
  dStack_40 = SUB168(auVar24 | auVar5,8);
  bounds.m_Box[2] = (double)local_48;
  bounds.m_Box[0] = (double)SUB168(auVar25 | auVar6,0);
  bounds.m_Box[1] = (double)SUB168(auVar25 | auVar6,8);
  bounds.m_Box[3] = dStack_40;
  RecalcActorFloorCeil(this_00,bounds);
  return true;
}

Assistant:

bool FPolyObj::RotatePolyobj (DAngle angle, bool fromsave)
{
	DAngle an;
	bool blocked;
	FBoundingBox oldbounds = Bounds;

	an = Angle + angle;

	UnLinkPolyobj();

	for(unsigned i=0;i < Vertices.Size(); i++)
	{
		PrevPts[i].pos = Vertices[i]->fPos();
		FPolyVertex torot = OriginalPts[i];
		RotatePt(an, torot.pos, StartSpot.pos);
		Vertices[i]->set(torot.pos.X, torot.pos.Y);
	}
	blocked = false;
	validcount++;
	UpdateBBox();

	// If we are loading a savegame we do not really want to damage actors and be blocked by them. This can also cause crashes when trying to damage incompletely deserialized player pawns.
	if (!fromsave)
	{
		for (unsigned i = 0; i < Sidedefs.Size(); i++)
		{
			if (CheckMobjBlocking(Sidedefs[i]))
			{
				blocked = true;
			}
		}
		if (blocked)
		{
			for(unsigned i=0;i < Vertices.Size(); i++)
			{
				Vertices[i]->set(PrevPts[i].pos.X, PrevPts[i].pos.Y);
			}
			UpdateBBox();
			LinkPolyobj();
			return false;
		}
	}
	Angle += angle;
	LinkPolyobj();
	ClearSubsectorLinks();
	RecalcActorFloorCeil(Bounds | oldbounds);
	return true;
}